

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_perform_user(connectdata *conn)

{
  imapstate iVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  iVar1 = IMAP_STOP;
  if (((conn->bits).field_0x5 & 1) != 0) {
    pcVar3 = "";
    if (conn->user != (char *)0x0) {
      pcVar3 = conn->user;
    }
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"USER %s",pcVar3);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    iVar1 = IMAP_LIST;
  }
  (conn->proto).imapc.state = iVar1;
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_perform_user(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, POP3_STOP);

    return result;
  }

  /* Send the USER command */
  result = Curl_pp_sendf(&conn->proto.pop3c.pp, "USER %s",
                         conn->user ? conn->user : "");
  if(!result)
    state(conn, POP3_USER);

  return result;
}